

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O1

void raviX_buffer_add_fstring(TextBuffer *mb,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar3;
  TextBuffer *mb_00;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar4;
  size_t n;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  n = 0x80;
  iVar3 = 0;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    uVar4 = (uint)n;
    raviX_buffer_reserve(mb,n);
    local_f8 = local_e8;
    local_100 = &args[0].overflow_arg_area;
    local_108 = 0x3000000010;
    mb_00 = (TextBuffer *)(mb->buf + mb->pos);
    uVar2 = uVar4;
    uVar1 = vsnprintf((char *)mb_00,n,fmt,&local_108);
    if ((int)uVar1 < (int)uVar4) {
      if ((int)uVar1 < 0) {
        raviX_buffer_add_fstring_cold_1();
        if (uVar2 != 0) {
          raviX_buffer_add_bytes(mb_00,"true",4);
          return;
        }
        raviX_buffer_add_bytes(mb_00,"false",5);
        return;
      }
      mb->pos = mb->pos + (ulong)uVar1;
      uVar2 = uVar4;
    }
    else {
      uVar2 = uVar1 + 1;
    }
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
  } while (((int)uVar4 <= (int)uVar1) && (n = (size_t)uVar2, bVar5));
  return;
}

Assistant:

void raviX_buffer_add_fstring(TextBuffer *mb, const char *fmt, ...)
{
	va_list args;
	int estimated_size = 128;

	for (int i = 0; i < 2; i++) {
		raviX_buffer_reserve(mb, estimated_size); // ensure we have at least estimated_size free space
		va_start(args, fmt);
		int n = vsnprintf(mb->buf + mb->pos, estimated_size, fmt, args);
		va_end(args);
		if (n >= estimated_size) {
			estimated_size = n + 1; // allow for 0 byte
		} else if (n < 0) {
			fprintf(stderr, "Buffer conversion error\n");
			assert(false);
			break;
		} else {
			mb->pos += n;
			break;
		}
	}
}